

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O2

void __thiscall
RuntimeInterface::GetInstanceExtensionProperties
          (RuntimeInterface *this,
          vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
          *extension_properties)

{
  value_type *__x;
  pointer pXVar1;
  pointer pXVar2;
  pointer pXVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  char *__s1;
  ulong __new_size;
  long lVar7;
  uint32_t count_output;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> runtime_extension_properties
  ;
  PFN_xrEnumerateInstanceExtensionProperties rt_xrEnumerateInstanceExtensionProperties;
  XrExtensionProperties example_properties;
  uint local_104;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *local_100;
  _Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> local_f8;
  PFN_xrVoidFunction local_d8;
  long local_d0;
  value_type local_c8;
  
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = extension_properties;
  (*this->_get_instance_proc_addr)
            ((XrInstance)0x0,"xrEnumerateInstanceExtensionProperties",&local_d8);
  local_104 = 0;
  (*local_d8)(0,0,&local_104,0);
  __new_size = (ulong)local_104;
  if (__new_size != 0) {
    memset(&local_c8,0,0x98);
    local_c8.type = XR_TYPE_EXTENSION_PROPERTIES;
    std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::resize
              ((vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)&local_f8,
               __new_size,&local_c8);
    (*local_d8)(0,(ulong)local_104,&local_104,local_f8._M_impl.super__Vector_impl_data._M_start);
  }
  local_d0 = ((long)local_f8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8._M_impl.super__Vector_impl_data._M_start) / 0x98;
  pXVar1 = (local_100->
           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pXVar2 = (local_100->
           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    if (lVar6 == local_d0) {
      std::_Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
      ~_Vector_base(&local_f8);
      return;
    }
    __x = local_f8._M_impl.super__Vector_impl_data._M_start + lVar6;
    pXVar3 = local_f8._M_impl.super__Vector_impl_data._M_start + lVar6;
    pcVar4 = ((local_100->
              super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>).
              _M_impl.super__Vector_impl_data._M_start)->extensionName;
    lVar7 = ((long)pXVar1 - (long)pXVar2) / 0x98 + 1;
    do {
      __s1 = pcVar4;
      lVar7 = lVar7 + -1;
      if (lVar7 == 0) {
        std::vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::push_back
                  (local_100,__x);
        goto LAB_00115d61;
      }
      iVar5 = strcmp(__s1,pXVar3->extensionName);
      pcVar4 = __s1 + 0x98;
    } while (iVar5 != 0);
    *(uint32_t *)(__s1 + 0x80) = __x->extensionVersion;
LAB_00115d61:
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void RuntimeInterface::GetInstanceExtensionProperties(std::vector<XrExtensionProperties>& extension_properties) {
    std::vector<XrExtensionProperties> runtime_extension_properties;
    PFN_xrEnumerateInstanceExtensionProperties rt_xrEnumerateInstanceExtensionProperties;
    _get_instance_proc_addr(XR_NULL_HANDLE, "xrEnumerateInstanceExtensionProperties",
                            reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrEnumerateInstanceExtensionProperties));
    uint32_t count = 0;
    uint32_t count_output = 0;
    // Get the count from the runtime
    rt_xrEnumerateInstanceExtensionProperties(nullptr, count, &count_output, nullptr);
    if (count_output > 0) {
        XrExtensionProperties example_properties{};
        example_properties.type = XR_TYPE_EXTENSION_PROPERTIES;
        runtime_extension_properties.resize(count_output, example_properties);
        count = count_output;
        rt_xrEnumerateInstanceExtensionProperties(nullptr, count, &count_output, runtime_extension_properties.data());
    }
    size_t ext_count = runtime_extension_properties.size();
    size_t props_count = extension_properties.size();
    for (size_t ext = 0; ext < ext_count; ++ext) {
        bool found = false;
        for (size_t prop = 0; prop < props_count; ++prop) {
            // If we find it, then make sure the spec version matches that of the runtime instead of the
            // layer.
            if (strcmp(extension_properties[prop].extensionName, runtime_extension_properties[ext].extensionName) == 0) {
                // Make sure the spec version used is the runtime's
                extension_properties[prop].extensionVersion = runtime_extension_properties[ext].extensionVersion;
                found = true;
                break;
            }
        }
        if (!found) {
            extension_properties.push_back(runtime_extension_properties[ext]);
        }
    }
}